

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionSettingsTestCase.cpp
# Opt level: O2

void __thiscall SuiteSessionSettingsTests::TeststripSpaces::RunImpl(TeststripSpaces *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  string *psVar4;
  FieldBase local_550;
  STRING local_4f0;
  allocator<char> local_4cc;
  allocator<char> local_4cb;
  allocator<char> local_4ca;
  allocator<char> local_4c9;
  FieldBase local_4c8;
  STRING local_468;
  FieldBase local_448;
  SessionSettings object;
  string local_358;
  STRING local_338;
  string configuration;
  SessionID session1;
  istringstream input;
  
  FIX::SessionSettings::SessionSettings(&object);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&configuration,
             " [ DEFAULT ] \nStringValue1=StringValue1\nStringValue2=StringValue2 \nStringValue3= StringValue3\nStringValue4 =StringValue4\n StringValue5=StringValue5\n  StringValue6  =  StringValue6  \nIntegerValue1=1\nIntegerValue2=2 \nIntegerValue3= 3\nIntegerValue4 =4\n IntegerValue5=5\n  IntegerValue6  =  6  \n  [  SESSION  ]  \nConnectionType=initiator\nBeginString=FIX.4.0\nSenderCompID=ISLD\nTargetCompID=TW\nDoubleValue1=1.1\nDoubleValue2=2.2 \nDoubleValue3= 3.3\nDoubleValue4 =4.4\n DoubleValue5=5.5\n  DoubleValue6  =  6.6  \n"
             ,(allocator<char> *)&input);
  std::__cxx11::istringstream::istringstream((istringstream *)&input,(string *)&configuration,_S_in)
  ;
  FIX::operator>>((istream *)&input,&object);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"FIX.4.0",&local_4c9);
  FIX::BeginString::BeginString((BeginString *)&local_550,&local_4f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"ISLD",&local_4ca);
  FIX::SenderCompID::SenderCompID((SenderCompID *)&local_4c8,&local_468);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"TW",&local_4cb);
  FIX::TargetCompID::TargetCompID((TargetCompID *)&local_448,&local_338);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"",&local_4cc);
  FIX::SessionID::SessionID
            (&session1,&local_550.m_string,&local_4c8.m_string,&local_448.m_string,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  FIX::FieldBase::~FieldBase(&local_448);
  std::__cxx11::string::~string((string *)&local_338);
  FIX::FieldBase::~FieldBase(&local_4c8);
  std::__cxx11::string::~string((string *)&local_468);
  FIX::FieldBase::~FieldBase(&local_550);
  std::__cxx11::string::~string((string *)&local_4f0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"StringValue1",(allocator<char> *)&local_4f0);
  FIX::Dictionary::getString((string *)&local_550,(bool)((char)&object + '0'));
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_448,*ppTVar3,0x118);
  UnitTest::CheckEqual<char[13],std::__cxx11::string>
            (pTVar1,(char (*) [13])"StringValue1",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_550,
             (TestDetails *)&local_448);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_4c8);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"StringValue2",(allocator<char> *)&local_4f0);
  FIX::Dictionary::getString((string *)&local_550,(bool)((char)&object + '0'));
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_448,*ppTVar3,0x119);
  UnitTest::CheckEqual<char[13],std::__cxx11::string>
            (pTVar1,(char (*) [13])"StringValue2",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_550,
             (TestDetails *)&local_448);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_4c8);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"StringValue3",(allocator<char> *)&local_4f0);
  FIX::Dictionary::getString((string *)&local_550,(bool)((char)&object + '0'));
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_448,*ppTVar3,0x11a);
  UnitTest::CheckEqual<char[13],std::__cxx11::string>
            (pTVar1,(char (*) [13])"StringValue3",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_550,
             (TestDetails *)&local_448);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_4c8);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"StringValue4",(allocator<char> *)&local_4f0);
  FIX::Dictionary::getString((string *)&local_550,(bool)((char)&object + '0'));
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_448,*ppTVar3,0x11b);
  UnitTest::CheckEqual<char[13],std::__cxx11::string>
            (pTVar1,(char (*) [13])"StringValue4",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_550,
             (TestDetails *)&local_448);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_4c8);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"StringValue5",(allocator<char> *)&local_4f0);
  FIX::Dictionary::getString((string *)&local_550,(bool)((char)&object + '0'));
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_448,*ppTVar3,0x11c);
  UnitTest::CheckEqual<char[13],std::__cxx11::string>
            (pTVar1,(char (*) [13])"StringValue5",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_550,
             (TestDetails *)&local_448);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_4c8);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"StringValue6",(allocator<char> *)&local_4f0);
  FIX::Dictionary::getString((string *)&local_550,(bool)((char)&object + '0'));
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_448,*ppTVar3,0x11d);
  UnitTest::CheckEqual<char[13],std::__cxx11::string>
            (pTVar1,(char (*) [13])"StringValue6",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_550,
             (TestDetails *)&local_448);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_4c8);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_448._vptr_FieldBase._0_4_ = 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_550,"IntegerValue1",(allocator<char> *)&local_468);
  local_4f0._M_dataplus._M_p._0_4_ = FIX::Dictionary::getInt((string *)&object.m_defaults);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_4c8,*ppTVar3,0x11f);
  UnitTest::CheckEqual<int,int>
            (pTVar1,(int *)&local_448,(int *)&local_4f0,(TestDetails *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_550);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_448._vptr_FieldBase._0_4_ = 2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_550,"IntegerValue2",(allocator<char> *)&local_468);
  local_4f0._M_dataplus._M_p._0_4_ = FIX::Dictionary::getInt((string *)&object.m_defaults);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_4c8,*ppTVar3,0x120);
  UnitTest::CheckEqual<int,int>
            (pTVar1,(int *)&local_448,(int *)&local_4f0,(TestDetails *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_550);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_448._vptr_FieldBase._0_4_ = 3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_550,"IntegerValue3",(allocator<char> *)&local_468);
  local_4f0._M_dataplus._M_p._0_4_ = FIX::Dictionary::getInt((string *)&object.m_defaults);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_4c8,*ppTVar3,0x121);
  UnitTest::CheckEqual<int,int>
            (pTVar1,(int *)&local_448,(int *)&local_4f0,(TestDetails *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_550);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_448._vptr_FieldBase._0_4_ = 4;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_550,"IntegerValue4",(allocator<char> *)&local_468);
  local_4f0._M_dataplus._M_p._0_4_ = FIX::Dictionary::getInt((string *)&object.m_defaults);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_4c8,*ppTVar3,0x122);
  UnitTest::CheckEqual<int,int>
            (pTVar1,(int *)&local_448,(int *)&local_4f0,(TestDetails *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_550);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_448._vptr_FieldBase._0_4_ = 5;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_550,"IntegerValue5",(allocator<char> *)&local_468);
  local_4f0._M_dataplus._M_p._0_4_ = FIX::Dictionary::getInt((string *)&object.m_defaults);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_4c8,*ppTVar3,0x123);
  UnitTest::CheckEqual<int,int>
            (pTVar1,(int *)&local_448,(int *)&local_4f0,(TestDetails *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_550);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_448._vptr_FieldBase = (_func_int **)CONCAT44(local_448._vptr_FieldBase._4_4_,6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_550,"IntegerValue6",(allocator<char> *)&local_468);
  local_4f0._M_dataplus._M_p._0_4_ = FIX::Dictionary::getInt((string *)&object.m_defaults);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_4c8,*ppTVar3,0x124);
  UnitTest::CheckEqual<int,int>
            (pTVar1,(int *)&local_448,(int *)&local_4f0,(TestDetails *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_550);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_448._vptr_FieldBase = (_func_int **)0x3ff199999999999a;
  psVar4 = (string *)FIX::SessionSettings::get((SessionID *)&object);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_550,"DoubleValue1",(allocator<char> *)&local_468);
  local_4f0._M_dataplus._M_p = (pointer)FIX::Dictionary::getDouble(psVar4);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_4c8,*ppTVar3,0x126);
  UnitTest::CheckEqual<double,double>
            (pTVar1,(double *)&local_448,(double *)&local_4f0,(TestDetails *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_550);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_448._vptr_FieldBase = (_func_int **)0x400199999999999a;
  psVar4 = (string *)FIX::SessionSettings::get((SessionID *)&object);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_550,"DoubleValue2",(allocator<char> *)&local_468);
  local_4f0._M_dataplus._M_p = (pointer)FIX::Dictionary::getDouble(psVar4);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_4c8,*ppTVar3,0x127);
  UnitTest::CheckEqual<double,double>
            (pTVar1,(double *)&local_448,(double *)&local_4f0,(TestDetails *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_550);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_448._vptr_FieldBase = (_func_int **)0x400a666666666666;
  psVar4 = (string *)FIX::SessionSettings::get((SessionID *)&object);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_550,"DoubleValue3",(allocator<char> *)&local_468);
  local_4f0._M_dataplus._M_p = (pointer)FIX::Dictionary::getDouble(psVar4);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_4c8,*ppTVar3,0x128);
  UnitTest::CheckEqual<double,double>
            (pTVar1,(double *)&local_448,(double *)&local_4f0,(TestDetails *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_550);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_448._vptr_FieldBase = (_func_int **)0x401199999999999a;
  psVar4 = (string *)FIX::SessionSettings::get((SessionID *)&object);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_550,"DoubleValue4",(allocator<char> *)&local_468);
  local_4f0._M_dataplus._M_p = (pointer)FIX::Dictionary::getDouble(psVar4);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_4c8,*ppTVar3,0x129);
  UnitTest::CheckEqual<double,double>
            (pTVar1,(double *)&local_448,(double *)&local_4f0,(TestDetails *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_550);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_448._vptr_FieldBase = (_func_int **)0x4016000000000000;
  psVar4 = (string *)FIX::SessionSettings::get((SessionID *)&object);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_550,"DoubleValue5",(allocator<char> *)&local_468);
  local_4f0._M_dataplus._M_p = (pointer)FIX::Dictionary::getDouble(psVar4);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_4c8,*ppTVar3,0x12a);
  UnitTest::CheckEqual<double,double>
            (pTVar1,(double *)&local_448,(double *)&local_4f0,(TestDetails *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_550);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_448._vptr_FieldBase = (_func_int **)0x401a666666666666;
  psVar4 = (string *)FIX::SessionSettings::get((SessionID *)&object);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_550,"DoubleValue6",(allocator<char> *)&local_468);
  local_4f0._M_dataplus._M_p = (pointer)FIX::Dictionary::getDouble(psVar4);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_4c8,*ppTVar3,299);
  UnitTest::CheckEqual<double,double>
            (pTVar1,(double *)&local_448,(double *)&local_4f0,(TestDetails *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_550);
  FIX::SessionID::~SessionID(&session1);
  std::__cxx11::istringstream::~istringstream((istringstream *)&input);
  std::__cxx11::string::~string((string *)&configuration);
  FIX::SessionSettings::~SessionSettings(&object);
  return;
}

Assistant:

TEST(stripSpaces)
{
  SessionSettings object;
  std::string configuration =
    " [ DEFAULT ] \n"
    "StringValue1=StringValue1\n"
    "StringValue2=StringValue2 \n"
    "StringValue3= StringValue3\n"
    "StringValue4 =StringValue4\n"
    " StringValue5=StringValue5\n"
    "  StringValue6  =  StringValue6  \n"
    "IntegerValue1=1\n"
    "IntegerValue2=2 \n"
    "IntegerValue3= 3\n"
    "IntegerValue4 =4\n"
    " IntegerValue5=5\n"
    "  IntegerValue6  =  6  \n"
    "  [  SESSION  ]  \n"
    "ConnectionType=initiator\n"
    "BeginString=FIX.4.0\n"
    "SenderCompID=ISLD\n"
    "TargetCompID=TW\n"
    "DoubleValue1=1.1\n"
    "DoubleValue2=2.2 \n"
    "DoubleValue3= 3.3\n"
    "DoubleValue4 =4.4\n"
    " DoubleValue5=5.5\n"
    "  DoubleValue6  =  6.6  \n";

  std::istringstream input( configuration );

  input >> object;

  SessionID session1( BeginString( "FIX.4.0" ),
                      SenderCompID( "ISLD" ),
                      TargetCompID( "TW" ) );

  CHECK_EQUAL( "StringValue1", object.get().getString( "StringValue1" ) );
  CHECK_EQUAL( "StringValue2", object.get().getString( "StringValue2" ) );
  CHECK_EQUAL( "StringValue3", object.get().getString( "StringValue3" ) );
  CHECK_EQUAL( "StringValue4", object.get().getString( "StringValue4" ) );
  CHECK_EQUAL( "StringValue5", object.get().getString( "StringValue5" ) );
  CHECK_EQUAL( "StringValue6", object.get().getString( "StringValue6" ) );

  CHECK_EQUAL( 1, object.get().getInt( "IntegerValue1" ) );
  CHECK_EQUAL( 2, object.get().getInt( "IntegerValue2" ) );
  CHECK_EQUAL( 3, object.get().getInt( "IntegerValue3" ) );
  CHECK_EQUAL( 4, object.get().getInt( "IntegerValue4" ) );
  CHECK_EQUAL( 5, object.get().getInt( "IntegerValue5" ) );
  CHECK_EQUAL( 6, object.get().getInt( "IntegerValue6" ) );

  CHECK_EQUAL( 1.1, object.get(session1).getDouble( "DoubleValue1" ) );
  CHECK_EQUAL( 2.2, object.get(session1).getDouble( "DoubleValue2" ) );
  CHECK_EQUAL( 3.3, object.get(session1).getDouble( "DoubleValue3" ) );
  CHECK_EQUAL( 4.4, object.get(session1).getDouble( "DoubleValue4" ) );
  CHECK_EQUAL( 5.5, object.get(session1).getDouble( "DoubleValue5" ) );
  CHECK_EQUAL( 6.6, object.get(session1).getDouble( "DoubleValue6" ) );
}